

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLNodeLaplacian.cpp
# Opt level: O2

void __thiscall
amrex::MLNodeLaplacian::restrictInteriorNodes
          (MLNodeLaplacian *this,int camrlev,MultiFab *crhs,MultiFab *a_frhs)

{
  BoxArray *ba;
  DistributionMapping *dm;
  int *piVar1;
  int iVar2;
  LinOpBCType LVar3;
  LinOpBCType LVar4;
  undefined8 uVar5;
  pointer pVVar6;
  Geometry *this_00;
  Geometry *this_01;
  pointer paVar7;
  pointer paVar8;
  ulong uVar9;
  FabArray<amrex::IArrayBox> *this_02;
  pointer puVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  int iVar21;
  long lVar22;
  int iVar23;
  ulong uVar24;
  long lVar25;
  int ioff;
  int iVar26;
  int iVar27;
  long lVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  int iVar38;
  int iVar39;
  long lVar40;
  long lVar41;
  int iVar42;
  int iVar43;
  long lVar44;
  long lVar45;
  long lVar46;
  long lVar47;
  long lVar48;
  long lVar49;
  int iVar50;
  long lVar51;
  long lVar52;
  int iVar53;
  long lVar54;
  long lVar55;
  long lVar56;
  int iVar57;
  long lVar58;
  double dVar59;
  double dVar60;
  double dVar61;
  double dVar62;
  double dVar63;
  double dVar64;
  double dVar65;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  double dVar68;
  double dVar69;
  double dVar70;
  double dVar71;
  double dVar72;
  double dVar73;
  double dVar74;
  double dVar75;
  double dVar76;
  double dVar77;
  double dVar78;
  double dVar79;
  undefined1 auVar80 [16];
  double dVar81;
  double dVar82;
  double dVar83;
  double dVar84;
  double dVar85;
  double dVar86;
  double dVar87;
  double dVar88;
  double dVar89;
  double dVar90;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  double dVar99;
  double dVar100;
  double dVar101;
  double dVar102;
  double dVar103;
  double dVar104;
  double dVar105;
  double dVar106;
  double dVar107;
  double dVar108;
  double dVar109;
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  double dVar112;
  double dVar113;
  double dVar114;
  double dVar115;
  double dVar116;
  double dVar117;
  double dVar118;
  double dVar119;
  double dVar128;
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  double dVar129;
  double dVar130;
  double dVar131;
  double dVar132;
  double dVar133;
  double dVar134;
  double dVar137;
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  double dVar138;
  double dVar139;
  double dVar140;
  double dVar141;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  double dVar146;
  double dVar147;
  double dVar148;
  double dVar149;
  double dVar150;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  double dVar156;
  double dVar157;
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  double dVar163;
  double dVar164;
  double dVar165;
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  double dVar166;
  double dVar178;
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  double dVar179;
  double dVar180;
  double dVar181;
  undefined1 auVar183 [16];
  double dVar182;
  double dVar187;
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  double dVar188;
  double dVar189;
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  double dVar196;
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  double dVar201;
  double dVar202;
  Periodicity PVar203;
  int local_820;
  int local_7f8;
  int local_7d8;
  Box local_7c4;
  _func_int **local_7a8;
  MLNodeLaplacian *local_7a0;
  undefined **local_798;
  long local_790;
  ulong local_788;
  __uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_> local_780;
  _Head_base<0UL,_amrex::LayoutData<int>_*,_false> local_778;
  long local_770;
  long local_768;
  long local_760;
  double local_758;
  undefined8 uStack_750;
  double local_748;
  undefined8 uStack_740;
  double local_738;
  undefined8 uStack_730;
  double local_728;
  double dStack_720;
  FabArray<amrex::FArrayBox> *local_718;
  double *local_710;
  double *local_708;
  double *local_700;
  undefined **local_6f8;
  int local_6ec;
  int local_6e8;
  int local_6e4;
  int local_6e0;
  int local_6dc;
  Array4<const_double> local_6d8;
  Array4<const_double> local_698;
  Box bx;
  MFIter mfi_1;
  Array4<const_double> local_388;
  MultiFab tmp_crhs;
  MFItInfo local_1c4;
  MultiFab cfine;
  
  ba = &(a_frhs->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray;
  dm = &(a_frhs->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.distributionMap;
  iVar17 = (this->super_MLNodeLinOp).super_MLLinOp.m_amr_ref_ratio.
           super_vector<int,_std::allocator<int>_>.super__Vector_base<int,_std::allocator<int>_>.
           _M_impl.super__Vector_impl_data._M_start[camrlev];
  uVar5 = *(undefined8 *)(a_frhs->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect;
  iVar15 = iVar17 + -1;
  local_7a0 = this;
  local_718 = &crhs->super_FabArray<amrex::FArrayBox>;
  if ((((int)uVar5 < iVar15) || ((int)((ulong)uVar5 >> 0x20) < iVar15)) ||
     ((a_frhs->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect[2] < iVar15)) {
    tmp_crhs.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase._0_4_ = 1;
    mfi_1.m_fa._M_t.
    super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
    super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
    super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._0_4_ = iVar15;
    std::
    make_unique<amrex::MultiFab,amrex::BoxArray_const&,amrex::DistributionMapping_const&,int,int>
              ((BoxArray *)&cfine,(DistributionMapping *)ba,(int *)dm,(int *)&tmp_crhs);
    MultiFab::Copy((MultiFab *)
                   cfine.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase,
                   a_frhs,0,0,1,0);
    a_frhs = (MultiFab *)
             cfine.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase;
  }
  else {
    cfine.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase = (_func_int **)0x0
    ;
  }
  pVVar6 = (local_7a0->super_MLNodeLinOp).super_MLLinOp.m_geom.
           super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
           .
           super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  this_00 = *(Geometry **)
             &pVVar6[camrlev].super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
              super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>;
  iVar15 = camrlev + 1;
  this_01 = *(Geometry **)
             &pVVar6[iVar15].super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
              super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>;
  bx.smallend.vect._0_8_ = *(undefined8 *)(this_01->domain).smallend.vect;
  uVar5 = *(undefined8 *)((this_01->domain).smallend.vect + 2);
  bx.bigend.vect[1] = (int)((ulong)*(undefined8 *)(this_01->domain).bigend.vect >> 0x20);
  bx._20_8_ = *(undefined8 *)((this_01->domain).bigend.vect + 2);
  bx.smallend.vect[2] = (int)uVar5;
  bx.bigend.vect[0] = (int)((ulong)uVar5 >> 0x20);
  for (lVar22 = 0; lVar22 != 3; lVar22 = lVar22 + 1) {
    if ((bx.btype.itype >> ((uint)lVar22 & 0x1f) & 1) == 0) {
      piVar1 = bx.bigend.vect + lVar22;
      *piVar1 = *piVar1 + 1;
    }
  }
  bx.btype.itype = 7;
  paVar7 = (local_7a0->super_MLNodeLinOp).super_MLLinOp.m_lobc.
           super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
           .
           super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  paVar8 = (local_7a0->super_MLNodeLinOp).super_MLLinOp.m_hibc.
           super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
           .
           super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar5 = *(undefined8 *)paVar7->_M_elems;
  LVar3 = paVar7->_M_elems[2];
  uVar9 = *(ulong *)paVar8->_M_elems;
  LVar4 = paVar8->_M_elems[2];
  this_02 = (FabArray<amrex::IArrayBox> *)
            **(undefined8 **)
              &(local_7a0->super_MLNodeLinOp).m_dirichlet_mask.
               super_vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
               .
               super__Vector_base<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[iVar15].
               super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
               .
               super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
  ;
  puVar10 = (local_7a0->m_nosigma_stencil).
            super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
            .
            super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_7a8 = cfine.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase;
  amrex::coarsen((BoxArray *)&tmp_crhs,ba,iVar17);
  mfi_1.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._4_4_ = 0;
  mfi_1.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._0_4_ = 1;
  mfi_1.fabArray._0_4_ = 0;
  mfi_1.fabArray._4_4_ = 0;
  mfi_1.tile_size.vect[0] = 0;
  mfi_1.tile_size.vect[1] = 0;
  mfi_1.tile_size.vect[2] = 0;
  mfi_1.flags = '\0';
  mfi_1._29_3_ = 0;
  mfi_1.currentIndex = 0;
  mfi_1.beginIndex = 0;
  local_6d8.p = (double *)&PTR__FabFactory_006d8928;
  MultiFab::MultiFab(&cfine,(BoxArray *)&tmp_crhs,dm,1,0,(MFInfo *)&mfi_1,
                     (FabFactory<amrex::FArrayBox> *)&local_6d8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&mfi_1.tile_size);
  BoxArray::~BoxArray((BoxArray *)&tmp_crhs);
  FabArray<amrex::FArrayBox>::setBndry<amrex::FArrayBox,_0>
            (&a_frhs->super_FabArray<amrex::FArrayBox>,0.0);
  tmp_crhs.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._0_12_ =
       Geometry::periodicity(this_01);
  FabArray<amrex::FArrayBox>::FillBoundary<double>
            (&a_frhs->super_FabArray<amrex::FArrayBox>,(Periodicity *)&tmp_crhs,false);
  MFIter::MFIter((MFIter *)&tmp_crhs,(FabArrayBase *)&cfine,true);
  iVar14 = bx.smallend.vect[0];
  local_760 = CONCAT44(local_760._4_4_,bx.smallend.vect[1]);
  local_768 = CONCAT44(local_768._4_4_,bx.smallend.vect[2]);
  local_770 = CONCAT44(local_770._4_4_,bx.bigend.vect[0]);
  local_778._M_head_impl._0_4_ = bx.bigend.vect[1];
  local_780._M_t.super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>.
  super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl._0_4_ = bx.bigend.vect[2];
  local_788 = uVar9 >> 0x20;
  while (tmp_crhs.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg
         .m_loshft.vect[0] <
         tmp_crhs.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg
         .m_loshft.vect[2]) {
    MFIter::tilebox(&local_7c4,(MFIter *)&tmp_crhs);
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              ((Array4<double> *)&mfi_1,&cfine.super_FabArray<amrex::FArrayBox>,(MFIter *)&tmp_crhs)
    ;
    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (&local_6d8,&a_frhs->super_FabArray<amrex::FArrayBox>,(MFIter *)&tmp_crhs);
    FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
              ((Array4<const_int> *)&local_698,this_02,(MFIter *)&tmp_crhs);
    if ((local_7a0->super_MLNodeLinOp).m_coarsening_strategy == Sigma) {
      iVar21 = local_7c4.bigend.vect[0] + 1;
      local_728 = (double)CONCAT44(local_728._4_4_,iVar21);
      local_790 = (long)local_7c4.smallend.vect[1];
      local_820 = (int)uVar5;
      local_7d8 = (int)uVar9;
      local_7f8 = (int)((ulong)uVar5 >> 0x20);
      if (iVar17 == 2) {
        iVar23 = local_7c4.smallend.vect[0] * 2 + 1;
        local_758 = (double)CONCAT44(local_758._4_4_,iVar23);
        for (iVar16 = local_7c4.smallend.vect[2]; iVar16 <= local_7c4.bigend.vect[2];
            iVar16 = iVar16 + 1) {
          lVar22 = (long)iVar16 * 2;
          local_738 = (double)local_698.jstride;
          local_748 = (double)((lVar22 - local_698.begin.z) * local_698.kstride * 4 +
                              (long)local_698.p);
          for (lVar20 = local_790; lVar20 <= local_7c4.bigend.vect[1]; lVar20 = lVar20 + 1) {
            if (local_7c4.smallend.vect[0] <= local_7c4.bigend.vect[0]) {
              lVar46 = (long)local_7c4.smallend.vect[0];
              iVar42 = local_7c4.smallend.vect[0] * 2;
              iVar2 = iVar23;
              do {
                dVar69 = 0.0;
                dVar68 = 0.0;
                if (*(int *)((long)local_748 +
                            ((lVar20 * 2 - (long)local_698.begin.y) * local_698.jstride +
                            (lVar46 * 2 - (long)local_698.begin.x)) * 4) == 0) {
                  for (iVar32 = -1; iVar32 != 2; iVar32 = iVar32 + 1) {
                    iVar30 = -iVar32;
                    if (iVar32 < 1) {
                      iVar30 = iVar32;
                    }
                    iVar11 = (int)lVar22;
                    iVar31 = iVar32 + iVar11;
                    for (iVar27 = -1; iVar27 != 2; iVar27 = iVar27 + 1) {
                      iVar38 = -iVar27;
                      if (iVar27 < 1) {
                        iVar38 = iVar27;
                      }
                      iVar12 = (int)(lVar20 * 2);
                      iVar43 = iVar27 + iVar12;
                      iVar53 = iVar2;
                      for (iVar26 = -1; iVar26 != 2; iVar26 = iVar26 + 1) {
                        iVar57 = -iVar26;
                        if (iVar26 < 1) {
                          iVar57 = iVar26;
                        }
                        if (((iVar42 + iVar26 < iVar14) &&
                            ((local_820 == 0x66 || (local_820 == 0x6a)))) ||
                           ((iVar50 = (int)(lVar46 * 2) + iVar26, (int)local_770 < iVar42 + iVar26
                            && ((local_7d8 == 0x6a || (local_7d8 == 0x66)))))) {
                          iVar50 = iVar53;
                        }
                        if (((iVar43 < (int)local_760) &&
                            ((local_7f8 == 0x66 || (local_7f8 == 0x6a)))) ||
                           ((iVar29 = iVar43, (int)local_778._M_head_impl < iVar43 &&
                            (((int)local_788 == 0x6a || ((int)local_788 == 0x66)))))) {
                          iVar29 = iVar12 - iVar27;
                        }
                        if (((iVar31 < (int)local_768) && ((LVar3 == Neumann || (LVar3 == inflow))))
                           || ((iVar39 = iVar31,
                               (int)local_780._M_t.
                                    super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>
                                    .super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl <
                               iVar31 && ((LVar4 == inflow || (LVar4 == Neumann)))))) {
                          iVar39 = iVar11 - iVar32;
                        }
                        dVar68 = dVar68 + (double)(iVar57 + 2) * (double)(iVar38 + 2) *
                                          (double)(iVar30 + 2) *
                                          (double)local_6d8.p
                                                  [((long)iVar29 - (long)local_6d8.begin.y) *
                                                   local_6d8.jstride +
                                                   ((long)iVar50 - (long)local_6d8.begin.x) +
                                                   ((long)iVar39 - (long)local_6d8.begin.z) *
                                                   local_6d8.kstride];
                        iVar53 = iVar53 + -1;
                      }
                    }
                  }
                  dVar69 = dVar68 * 0.015625;
                }
                *(double *)
                 ((lVar20 - mfi_1.beginIndex) * CONCAT44(mfi_1.fabArray._4_4_,(int)mfi_1.fabArray) *
                  8 + CONCAT44(mfi_1.m_fa._M_t.
                               super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                               .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl.
                               _4_4_,(int)mfi_1.m_fa._M_t.
                                          super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                                          .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>.
                                          _M_head_impl) +
                  ((long)iVar16 - (long)mfi_1.endIndex) * mfi_1.tile_size.vect._0_8_ * 8 +
                 (lVar46 - mfi_1.currentIndex) * 8) = dVar69;
                lVar46 = lVar46 + 1;
                iVar2 = iVar2 + 2;
                iVar42 = iVar42 + 2;
              } while (iVar21 != (int)lVar46);
            }
          }
        }
      }
      else {
        iVar23 = local_7c4.smallend.vect[0] * 4 + 3;
        local_758 = (double)CONCAT44(local_758._4_4_,iVar23);
        for (iVar16 = local_7c4.smallend.vect[2]; iVar16 <= local_7c4.bigend.vect[2];
            iVar16 = iVar16 + 1) {
          lVar22 = (long)iVar16 * 4;
          local_738 = (double)local_698.jstride;
          local_748 = (double)((lVar22 - local_698.begin.z) * local_698.kstride * 4 +
                              (long)local_698.p);
          for (lVar20 = local_790; lVar20 <= local_7c4.bigend.vect[1]; lVar20 = lVar20 + 1) {
            if (local_7c4.smallend.vect[0] <= local_7c4.bigend.vect[0]) {
              lVar46 = (long)local_7c4.smallend.vect[0];
              iVar42 = local_7c4.smallend.vect[0] * 4;
              iVar2 = iVar23;
              do {
                dVar68 = 0.0;
                if (*(int *)((long)local_748 +
                            ((lVar20 * 4 - (long)local_698.begin.y) * local_698.jstride +
                            (lVar46 * 4 - (long)local_698.begin.x)) * 4) == 0) {
                  for (iVar32 = -3; iVar32 != 4; iVar32 = iVar32 + 1) {
                    iVar30 = -iVar32;
                    if (iVar32 < 1) {
                      iVar30 = iVar32;
                    }
                    iVar11 = (int)lVar22;
                    iVar31 = iVar32 + iVar11;
                    for (iVar27 = -3; iVar27 != 4; iVar27 = iVar27 + 1) {
                      iVar38 = -iVar27;
                      if (iVar27 < 1) {
                        iVar38 = iVar27;
                      }
                      iVar12 = (int)(lVar20 * 4);
                      iVar43 = iVar27 + iVar12;
                      iVar53 = iVar2;
                      for (iVar26 = -3; iVar26 != 4; iVar26 = iVar26 + 1) {
                        iVar57 = -iVar26;
                        if (iVar26 < 1) {
                          iVar57 = iVar26;
                        }
                        if (((iVar42 + iVar26 < iVar14) &&
                            ((local_820 == 0x66 || (local_820 == 0x6a)))) ||
                           ((iVar50 = (int)(lVar46 * 4) + iVar26, (int)local_770 < iVar42 + iVar26
                            && ((local_7d8 == 0x6a || (local_7d8 == 0x66)))))) {
                          iVar50 = iVar53;
                        }
                        if (((iVar43 < (int)local_760) &&
                            ((local_7f8 == 0x66 || (local_7f8 == 0x6a)))) ||
                           ((iVar29 = iVar43, (int)local_778._M_head_impl < iVar43 &&
                            (((int)local_788 == 0x6a || ((int)local_788 == 0x66)))))) {
                          iVar29 = iVar12 - iVar27;
                        }
                        if (((iVar31 < (int)local_768) && ((LVar3 == Neumann || (LVar3 == inflow))))
                           || ((iVar39 = iVar31,
                               (int)local_780._M_t.
                                    super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>
                                    .super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl <
                               iVar31 && ((LVar4 == inflow || (LVar4 == Neumann)))))) {
                          iVar39 = iVar11 - iVar32;
                        }
                        dVar68 = dVar68 + (double)(iVar57 + 4) * (double)(iVar38 + 4) *
                                          (double)(iVar30 + 4) *
                                          (double)local_6d8.p
                                                  [((long)iVar29 - (long)local_6d8.begin.y) *
                                                   local_6d8.jstride +
                                                   ((long)iVar50 - (long)local_6d8.begin.x) +
                                                   ((long)iVar39 - (long)local_6d8.begin.z) *
                                                   local_6d8.kstride];
                        iVar53 = iVar53 + -1;
                      }
                    }
                  }
                  dVar68 = dVar68 * 0.000244140625;
                }
                *(double *)
                 ((lVar20 - mfi_1.beginIndex) * CONCAT44(mfi_1.fabArray._4_4_,(int)mfi_1.fabArray) *
                  8 + CONCAT44(mfi_1.m_fa._M_t.
                               super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                               .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl.
                               _4_4_,(int)mfi_1.m_fa._M_t.
                                          super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                                          .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>.
                                          _M_head_impl) +
                  ((long)iVar16 - (long)mfi_1.endIndex) * mfi_1.tile_size.vect._0_8_ * 8 +
                 (lVar46 - mfi_1.currentIndex) * 8) = dVar68;
                lVar46 = lVar46 + 1;
                iVar2 = iVar2 + 4;
                iVar42 = iVar42 + 4;
              } while (iVar21 != (int)lVar46);
            }
          }
        }
      }
    }
    else {
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_388,
                 (FabArray<amrex::FArrayBox> *)
                 puVar10[iVar15]._M_t.
                 super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,
                 (MFIter *)&tmp_crhs);
      local_6ec = local_7c4.bigend.vect[2];
      local_790 = CONCAT44(local_790._4_4_,local_7c4.bigend.vect[0] + 1);
      iVar21 = local_7c4.smallend.vect[2];
      while (iVar16 = iVar21, iVar16 <= local_7c4.bigend.vect[2]) {
        lVar22 = (long)iVar16 * 2;
        iVar21 = (int)lVar22;
        local_6dc = iVar21 + -2;
        local_6e0 = iVar21 + -1;
        local_6e4 = iVar21 + 1;
        for (lVar20 = (long)local_7c4.smallend.vect[1]; lVar20 <= local_7c4.bigend.vect[1];
            lVar20 = lVar20 + 1) {
          if (local_7c4.smallend.vect[0] <= local_7c4.bigend.vect[0]) {
            lVar13 = lVar20 * 2;
            lVar33 = (long)local_6d8.begin.y;
            local_6f8 = (undefined **)(local_6d8.p + (lVar13 - lVar33) * local_6d8.jstride);
            lVar47 = (long)local_388.begin.y;
            lVar46 = lVar20 * 2 + -1;
            lVar18 = lVar20 * 2 + 1;
            lVar45 = (lVar13 - lVar47) * local_388.jstride;
            lVar54 = (((int)lVar13 - local_388.begin.y) + -2) * local_388.jstride;
            lVar55 = (lVar46 - lVar47) * local_388.jstride;
            lVar51 = (lVar18 - lVar47) * local_388.jstride;
            lVar28 = (lVar46 - lVar33) * local_6d8.jstride;
            lVar58 = (lVar18 - lVar33) * local_6d8.jstride;
            lVar48 = (iVar21 - local_388.begin.z) * local_388.kstride;
            lVar34 = (local_6dc - local_388.begin.z) * local_388.kstride;
            lVar35 = (local_6e0 - local_388.begin.z) * local_388.kstride;
            lVar36 = (local_6e4 - local_388.begin.z) * local_388.kstride;
            lVar44 = (iVar21 - local_6d8.begin.z) * local_6d8.kstride;
            lVar18 = (local_6e0 - local_6d8.begin.z) * local_6d8.kstride;
            lVar33 = (local_6e4 - local_6d8.begin.z) * local_6d8.kstride;
            lVar47 = (long)local_6d8.begin.x;
            lVar19 = (long)local_388.begin.x;
            local_798 = local_6f8 + lVar44;
            lVar46 = (long)local_7c4.smallend.vect[0];
            do {
              uVar24 = lVar46 * 2;
              dVar68 = 0.0;
              if (*(int *)((long)local_698.p +
                          (uVar24 - (long)local_698.begin.x) * 4 +
                          (lVar13 - local_698.begin.y) * local_698.jstride * 4 +
                          (lVar22 - local_698.begin.z) * local_698.kstride * 4) == 0) {
                lVar49 = uVar24 - lVar47;
                lVar37 = (long)(((int)uVar24 - local_388.begin.x) + -2);
                lVar52 = uVar24 - 1;
                lVar56 = lVar52 - lVar19;
                dVar68 = local_388.p[lVar45 + lVar56 + lVar48 + local_388.nstride];
                if (((local_388.p[lVar45 + lVar37 + lVar48 + local_388.nstride] != 0.0) ||
                    (dVar68 != 0.0)) || (NAN(dVar68))) {
                  dVar68 = ((double)local_798[lVar52 - lVar47] * ABS(dVar68)) /
                           (ABS(local_388.p[lVar45 + lVar37 + lVar48 + local_388.nstride]) +
                           ABS(dVar68));
                }
                else {
                  dVar68 = (double)local_798[lVar52 - lVar47] * 0.5;
                }
                lVar40 = uVar24 - lVar19;
                uVar24 = uVar24 | 1;
                dVar69 = local_388.p[lVar45 + lVar40 + lVar48 + local_388.nstride];
                dVar70 = (local_388.p + lVar45 + lVar40 + lVar48 + local_388.nstride)[1];
                if (((dVar69 != 0.0) || (NAN(dVar69))) || ((dVar70 != 0.0 || (NAN(dVar70))))) {
                  dVar69 = ((double)local_798[uVar24 - lVar47] * ABS(dVar69)) /
                           (ABS(dVar70) + ABS(dVar69));
                }
                else {
                  dVar69 = (double)local_798[uVar24 - lVar47] * 0.5;
                }
                dVar70 = local_388.p[lVar54 + lVar40 + lVar48 + local_388.nstride * 2];
                dVar71 = local_388.p[lVar55 + lVar40 + lVar48 + local_388.nstride * 2];
                if (((dVar70 != 0.0) || (NAN(dVar70))) || ((dVar71 != 0.0 || (NAN(dVar71))))) {
                  dVar70 = ((double)local_6d8.p[lVar28 + lVar44 + lVar49] * ABS(dVar71)) /
                           (ABS(dVar70) + ABS(dVar71));
                }
                else {
                  dVar70 = (double)local_6d8.p[lVar28 + lVar44 + lVar49] * 0.5;
                }
                dVar71 = local_388.p[lVar45 + lVar40 + lVar48 + local_388.nstride * 2];
                dVar72 = local_388.p[lVar51 + lVar40 + lVar48 + local_388.nstride * 2];
                if ((((dVar71 != 0.0) || (NAN(dVar71))) || (dVar72 != 0.0)) || (NAN(dVar72))) {
                  dVar71 = ((double)local_6d8.p[lVar58 + lVar44 + lVar49] * ABS(dVar71)) /
                           (ABS(dVar71) + ABS(dVar72));
                }
                else {
                  dVar71 = (double)local_6d8.p[lVar58 + lVar44 + lVar49] * 0.5;
                }
                dVar72 = local_388.p[lVar45 + lVar40 + lVar34 + local_388.nstride * 3];
                dVar73 = local_388.p[lVar45 + lVar40 + lVar35 + local_388.nstride * 3];
                if (((dVar72 != 0.0) || (NAN(dVar72))) || ((dVar73 != 0.0 || (NAN(dVar73))))) {
                  dVar72 = ((double)local_6f8[lVar49 + lVar18] * ABS(dVar73)) /
                           (ABS(dVar72) + ABS(dVar73));
                }
                else {
                  dVar72 = (double)local_6f8[lVar49 + lVar18] * 0.5;
                }
                lVar41 = uVar24 - lVar19;
                dVar73 = local_388.p[lVar45 + lVar40 + lVar48 + local_388.nstride * 3];
                dVar59 = local_388.p[lVar45 + lVar40 + lVar36 + local_388.nstride * 3];
                if (((dVar73 != 0.0) || (NAN(dVar73))) || ((dVar59 != 0.0 || (NAN(dVar59))))) {
                  dVar73 = ((double)local_6f8[lVar49 + lVar33] * ABS(dVar73)) /
                           (ABS(dVar73) + ABS(dVar59));
                }
                else {
                  dVar73 = (double)local_6f8[lVar49 + lVar33] * 0.5;
                }
                dVar104 = ABS(local_388.p[lVar54 + lVar37 + lVar48 + local_388.nstride * 4]);
                dVar74 = ABS(local_388.p[lVar55 + lVar37 + lVar48 + local_388.nstride * 4]);
                dVar129 = ABS(local_388.p[lVar54 + lVar56 + lVar48 + local_388.nstride * 4]);
                dVar112 = ABS(local_388.p[lVar55 + lVar56 + lVar48 + local_388.nstride * 4]);
                dVar138 = ABS(local_388.p[lVar54 + lVar56 + lVar48 + local_388.nstride * 2]) /
                          (dVar104 + dVar129 + 1e-100);
                dVar146 = ABS(local_388.p[lVar55 + lVar56 + lVar48 + local_388.nstride * 2]) /
                          (dVar74 + dVar112 + 1e-100);
                dVar81 = ABS(local_388.p[lVar55 + lVar37 + lVar48 + local_388.nstride]) /
                         (dVar104 + dVar74 + 1e-100) + 1.0;
                dVar99 = ABS(local_388.p[lVar55 + lVar56 + lVar48 + local_388.nstride]) /
                         (dVar129 + dVar112 + 1e-100) + 1.0;
                dVar112 = (dVar99 + dVar146) * dVar112;
                lVar52 = lVar52 - lVar47;
                dVar105 = ABS(local_388.p[lVar54 + lVar40 + lVar48 + local_388.nstride * 4]);
                dVar59 = ABS(local_388.p[lVar55 + lVar40 + lVar48 + local_388.nstride * 4]);
                dVar139 = ABS(local_388.p[lVar54 + lVar41 + lVar48 + local_388.nstride * 4]);
                dVar113 = ABS(local_388.p[lVar55 + lVar41 + lVar48 + local_388.nstride * 4]);
                dVar130 = ABS(local_388.p[lVar54 + lVar41 + lVar48 + local_388.nstride * 2]) /
                          (dVar105 + dVar139 + 1e-100);
                dVar147 = ABS(local_388.p[lVar55 + lVar41 + lVar48 + local_388.nstride * 2]) /
                          (dVar59 + dVar113 + 1e-100);
                dVar82 = ABS(local_388.p[lVar55 + lVar40 + lVar48 + local_388.nstride]) /
                         (dVar105 + dVar59 + 1e-100) + 1.0;
                dVar100 = ABS(local_388.p[lVar55 + lVar41 + lVar48 + local_388.nstride]) /
                          (dVar139 + dVar113 + 1e-100) + 1.0;
                dVar59 = (dVar82 + dVar147) * dVar59;
                lVar25 = uVar24 - lVar47;
                dVar114 = ABS(local_388.p[lVar45 + lVar37 + lVar48 + local_388.nstride * 4]);
                dVar106 = ABS(local_388.p[lVar51 + lVar37 + lVar48 + local_388.nstride * 4]);
                dVar140 = ABS(local_388.p[lVar45 + lVar56 + lVar48 + local_388.nstride * 4]);
                dVar131 = ABS(local_388.p[lVar51 + lVar56 + lVar48 + local_388.nstride * 4]);
                dVar75 = ABS(local_388.p[lVar45 + lVar56 + lVar48 + local_388.nstride * 2]) /
                         (dVar114 + dVar140 + 1e-100);
                dVar148 = ABS(local_388.p[lVar51 + lVar56 + lVar48 + local_388.nstride * 2]) /
                          (dVar106 + dVar131 + 1e-100);
                dVar83 = ABS(local_388.p[lVar51 + lVar37 + lVar48 + local_388.nstride]) /
                         (dVar114 + dVar106 + 1e-100) + 1.0;
                dVar101 = ABS(local_388.p[lVar51 + lVar56 + lVar48 + local_388.nstride]) /
                          (dVar140 + dVar131 + 1e-100) + 1.0;
                dVar140 = (dVar75 + dVar101) * dVar140;
                dVar60 = ABS(local_388.p[lVar51 + lVar40 + lVar48 + local_388.nstride * 4]);
                dVar115 = ABS(local_388.p[lVar45 + lVar40 + lVar48 + local_388.nstride * 4]);
                dVar132 = ABS(local_388.p[lVar51 + lVar41 + lVar48 + local_388.nstride * 4]);
                dVar141 = ABS(local_388.p[lVar45 + lVar41 + lVar48 + local_388.nstride * 4]);
                dVar107 = ABS(local_388.p[lVar45 + lVar41 + lVar48 + local_388.nstride * 2]) /
                          (dVar115 + dVar141 + 1e-100);
                dVar149 = ABS(local_388.p[lVar51 + lVar41 + lVar48 + local_388.nstride * 2]) /
                          (dVar60 + dVar132 + 1e-100);
                dVar84 = ABS(local_388.p[lVar51 + lVar40 + lVar48 + local_388.nstride]) /
                         (dVar60 + dVar115 + 1e-100) + 1.0;
                dVar115 = (dVar84 + dVar107) * dVar115;
                dVar102 = ABS(local_388.p[lVar51 + lVar41 + lVar48 + local_388.nstride]) /
                          (dVar132 + dVar141 + 1e-100) + 1.0;
                dVar76 = ABS(local_388.p[lVar45 + lVar37 + lVar34 + local_388.nstride * 5]);
                dVar85 = ABS(local_388.p[lVar45 + lVar37 + lVar35 + local_388.nstride * 5]);
                dVar188 = ABS(local_388.p[lVar45 + lVar56 + lVar34 + local_388.nstride * 5]);
                dVar179 = ABS(local_388.p[lVar45 + lVar56 + lVar35 + local_388.nstride * 5]);
                dVar196 = ABS(local_388.p[lVar45 + lVar56 + lVar34 + local_388.nstride * 3]) /
                          (dVar76 + dVar188 + 1e-100);
                dVar201 = ABS(local_388.p[lVar45 + lVar56 + lVar35 + local_388.nstride * 3]) /
                          (dVar85 + dVar179 + 1e-100);
                dVar103 = ABS(local_388.p[lVar45 + lVar37 + lVar35 + local_388.nstride]) /
                          (dVar76 + dVar85 + 1e-100) + 1.0;
                dVar61 = ABS(local_388.p[lVar45 + lVar37 + lVar36 + local_388.nstride * 5]);
                dVar163 = ABS(local_388.p[lVar45 + lVar37 + lVar48 + local_388.nstride * 5]);
                dVar77 = ABS(local_388.p[lVar45 + lVar56 + lVar36 + local_388.nstride * 5]);
                dVar86 = ABS(local_388.p[lVar45 + lVar56 + lVar48 + local_388.nstride * 5]);
                dVar78 = ABS(local_388.p[lVar45 + lVar56 + lVar48 + local_388.nstride * 3]) /
                         (dVar163 + dVar86 + 1e-100);
                dVar108 = ABS(local_388.p[lVar45 + lVar37 + lVar36 + local_388.nstride]) /
                          (dVar61 + dVar163 + 1e-100) + 1.0;
                dVar62 = ABS(local_388.p[lVar45 + lVar56 + lVar36 + local_388.nstride]) /
                         (dVar77 + dVar86 + 1e-100) + 1.0;
                dVar86 = (dVar78 + dVar62) * dVar86;
                dVar156 = ABS(local_388.p[lVar45 + lVar56 + lVar35 + local_388.nstride]) /
                          (dVar188 + dVar179 + 1e-100) + 1.0;
                dVar179 = (dVar156 + dVar201) * dVar179;
                dVar116 = ABS(local_388.p[lVar45 + lVar40 + lVar34 + local_388.nstride * 5]);
                dVar63 = ABS(local_388.p[lVar45 + lVar40 + lVar35 + local_388.nstride * 5]);
                local_700 = local_388.p + lVar45 + lVar41 + lVar35;
                dVar157 = ABS(local_388.p[lVar45 + lVar41 + lVar34 + local_388.nstride * 5]);
                dVar87 = ABS(local_700[local_388.nstride * 5]);
                dVar202 = ABS(local_388.p[lVar45 + lVar41 + lVar34 + local_388.nstride * 3]) /
                          (dVar116 + dVar157 + 1e-100);
                dVar88 = ABS(local_700[local_388.nstride * 3]) / (dVar63 + dVar87 + 1e-100);
                dVar180 = ABS(local_388.p[lVar45 + lVar40 + lVar35 + local_388.nstride]) /
                          (dVar116 + dVar63 + 1e-100) + 1.0;
                dVar189 = ABS(local_700[local_388.nstride]) / (dVar157 + dVar87 + 1e-100) + 1.0;
                dVar63 = (dVar180 + dVar88) * dVar63;
                dVar117 = ABS(local_388.p[lVar45 + lVar56 + lVar36 + local_388.nstride * 3]) /
                          (dVar61 + dVar77 + 1e-100);
                dVar109 = ABS(local_388.p[lVar45 + lVar40 + lVar36 + local_388.nstride * 5]);
                dVar64 = ABS(local_388.p[lVar45 + lVar40 + lVar48 + local_388.nstride * 5]);
                dVar133 = ABS(local_388.p[lVar45 + lVar41 + lVar36 + local_388.nstride * 5]);
                dVar150 = ABS(local_388.p[lVar45 + lVar41 + lVar48 + local_388.nstride * 5]);
                dVar164 = ABS(local_388.p[lVar45 + lVar41 + lVar48 + local_388.nstride * 3]) /
                          (dVar64 + dVar150 + 1e-100);
                dVar181 = ABS(local_388.p[lVar45 + lVar41 + lVar36 + local_388.nstride * 3]) /
                          (dVar109 + dVar133 + 1e-100);
                dVar89 = ABS(local_388.p[lVar45 + lVar40 + lVar36 + local_388.nstride]) /
                         (dVar109 + dVar64 + 1e-100) + 1.0;
                dVar64 = (dVar89 + dVar164) * dVar64;
                dVar118 = ABS(local_388.p[lVar45 + lVar41 + lVar36 + local_388.nstride]) /
                          (dVar133 + dVar150 + 1e-100) + 1.0;
                dVar165 = ABS(local_388.p[lVar54 + lVar40 + lVar35 + local_388.nstride * 6]);
                dVar90 = ABS(local_388.p[lVar51 + lVar40 + lVar35 + local_388.nstride * 6]);
                local_708 = local_388.p + lVar54 + lVar40 + lVar34;
                dVar119 = ABS(local_708[local_388.nstride * 6]);
                dVar128 = ABS(local_388.p[lVar45 + lVar40 + lVar34 + local_388.nstride * 6]);
                dVar65 = ABS(local_388.p[lVar54 + lVar40 + lVar35 + local_388.nstride * 2]) /
                         (dVar119 + dVar165 + 1e-100) + 1.0;
                local_710 = local_388.p + lVar55 + lVar40 + lVar35;
                dVar134 = ABS(local_710[local_388.nstride * 6]);
                dVar137 = ABS(local_388.p[lVar45 + lVar40 + lVar35 + local_388.nstride * 6]);
                auVar193._0_8_ = ABS(local_710[local_388.nstride * 3]);
                auVar193._8_8_ = ABS(local_388.p[lVar51 + lVar40 + lVar35 + local_388.nstride * 3]);
                auVar183._0_8_ = dVar134 + dVar165 + 1e-100;
                auVar183._8_8_ = dVar90 + dVar137 + 1e-100;
                auVar110 = divpd(auVar193,auVar183);
                auVar167._0_8_ = ABS(local_710[local_388.nstride * 2]);
                auVar167._8_8_ = ABS(local_388.p[lVar45 + lVar40 + lVar35 + local_388.nstride * 2]);
                dVar182 = ABS(local_388.p[lVar55 + lVar40 + lVar34 + local_388.nstride * 6]);
                dVar187 = ABS(local_388.p[lVar51 + lVar40 + lVar34 + local_388.nstride * 6]);
                auVar197._0_8_ = dVar182 + dVar134 + 1e-100;
                auVar197._8_8_ = dVar137 + dVar128 + 1e-100;
                auVar168 = divpd(auVar167,auVar197);
                auVar190._0_8_ = ABS(local_388.p[lVar55 + lVar40 + lVar34 + local_388.nstride * 3]);
                auVar190._8_8_ = ABS(local_388.p[lVar51 + lVar40 + lVar34 + local_388.nstride * 3]);
                auVar198._0_8_ = dVar119 + dVar182 + 1e-100;
                auVar198._8_8_ = dVar128 + dVar187 + 1e-100;
                auVar191 = divpd(auVar190,auVar198);
                dVar166 = auVar168._0_8_ + 1.0;
                dVar178 = auVar168._8_8_ + 1.0;
                dVar79 = ABS(local_388.p[lVar51 + lVar40 + lVar35 + local_388.nstride * 2]) /
                         (dVar187 + dVar90 + 1e-100) + 1.0;
                dVar134 = (auVar110._0_8_ + dVar166) * dVar134;
                dVar137 = (auVar110._8_8_ + dVar178) * dVar137;
                auVar168._0_8_ = (double)local_6d8.p[lVar28 + lVar49 + lVar18] * dVar134;
                auVar168._8_8_ = (double)local_6d8.p[lVar58 + lVar49 + lVar18] * dVar137;
                auVar120._0_8_ =
                     dVar134 + (dVar65 + auVar110._0_8_) * dVar165 +
                               (dVar166 + auVar191._0_8_) * dVar182 +
                               (dVar65 + auVar191._0_8_) * dVar119 + 1e-100;
                auVar120._8_8_ =
                     (auVar110._8_8_ + dVar79) * dVar90 +
                     dVar137 + (dVar79 + auVar191._8_8_) * dVar187 +
                               (dVar178 + auVar191._8_8_) * dVar128 + 1e-100;
                auVar110 = divpd(auVar168,auVar120);
                dVar65 = ABS(local_388.p[lVar54 + lVar40 + lVar48 + local_388.nstride * 6]);
                dVar128 = ABS(local_388.p[lVar51 + lVar40 + lVar48 + local_388.nstride * 6]);
                dVar119 = ABS(local_388.p[lVar54 + lVar40 + lVar36 + local_388.nstride * 6]);
                dVar134 = ABS(local_388.p[lVar45 + lVar40 + lVar36 + local_388.nstride * 6]);
                dVar187 = ABS(local_388.p[lVar54 + lVar40 + lVar36 + local_388.nstride * 2]) /
                          (dVar119 + dVar65 + 1e-100) + 1.0;
                dVar79 = ABS(local_388.p[lVar55 + lVar40 + lVar48 + local_388.nstride * 6]);
                dVar90 = ABS(local_388.p[lVar45 + lVar40 + lVar48 + local_388.nstride * 6]);
                auVar169._0_8_ = ABS(local_388.p[lVar55 + lVar40 + lVar48 + local_388.nstride * 3]);
                auVar169._8_8_ = ABS(local_388.p[lVar51 + lVar40 + lVar48 + local_388.nstride * 3]);
                auVar121._0_8_ = dVar79 + dVar65 + 1e-100;
                auVar121._8_8_ = dVar128 + dVar90 + 1e-100;
                auVar170 = divpd(auVar169,auVar121);
                auVar135._0_8_ = ABS(local_388.p[lVar55 + lVar40 + lVar36 + local_388.nstride * 2]);
                auVar135._8_8_ = ABS(local_388.p[lVar45 + lVar40 + lVar36 + local_388.nstride * 2]);
                dVar166 = ABS(local_388.p[lVar55 + lVar40 + lVar36 + local_388.nstride * 6]);
                dVar178 = ABS(local_388.p[lVar51 + lVar40 + lVar36 + local_388.nstride * 6]);
                auVar143._0_8_ = dVar166 + dVar79 + 1e-100;
                auVar143._8_8_ = dVar90 + dVar134 + 1e-100;
                auVar191 = divpd(auVar135,auVar143);
                auVar145._0_8_ = ABS(local_388.p[lVar55 + lVar40 + lVar36 + local_388.nstride * 3]);
                auVar145._8_8_ = ABS(local_388.p[lVar51 + lVar40 + lVar36 + local_388.nstride * 3]);
                auVar184._0_8_ = dVar119 + dVar166 + 1e-100;
                auVar184._8_8_ = dVar178 + dVar134 + 1e-100;
                auVar168 = divpd(auVar145,auVar184);
                dVar137 = auVar191._0_8_ + 1.0;
                dVar165 = auVar191._8_8_ + 1.0;
                dVar79 = (auVar170._0_8_ + dVar137) * dVar79;
                dVar90 = (auVar170._8_8_ + dVar165) * dVar90;
                dVar182 = ABS(local_388.p[lVar51 + lVar40 + lVar36 + local_388.nstride * 2]) /
                          (dVar178 + dVar128 + 1e-100) + 1.0;
                local_758 = local_388.p[lVar51 + lVar37 + lVar48 + local_388.nstride * 7];
                uStack_750 = 0;
                auVar191._0_8_ =
                     dVar79 + (dVar187 + auVar170._0_8_) * dVar65 +
                     (dVar187 + auVar168._0_8_) * dVar119 + (dVar137 + auVar168._0_8_) * dVar166 +
                     1e-100;
                auVar191._8_8_ =
                     (auVar170._8_8_ + dVar182) * dVar128 + dVar90 +
                     (dVar165 + auVar168._8_8_) * dVar134 + (dVar182 + auVar168._8_8_) * dVar178 +
                     1e-100;
                auVar172._8_8_ = (double)local_6d8.p[lVar58 + lVar49 + lVar33] * dVar90;
                auVar172._0_8_ = (double)local_6d8.p[lVar28 + lVar49 + lVar33] * dVar79;
                auVar168 = divpd(auVar172,auVar191);
                dStack_720 = auVar168._8_8_;
                local_728 = dStack_720 +
                            auVar110._8_8_ +
                            ((double)local_6f8[lVar25 + lVar33] * dVar64) /
                            ((dVar164 + dVar118) * dVar150 + dVar64 + (dVar89 + dVar181) * dVar109 +
                             (dVar118 + dVar181) * dVar133 + 1e-100) +
                            (dVar86 * (double)local_6f8[lVar52 + lVar33]) /
                            ((dVar108 + dVar78) * dVar163 + dVar86 + (dVar108 + dVar117) * dVar61 +
                             (dVar62 + dVar117) * dVar77 + 1e-100) +
                            ((double)local_6f8[lVar25 + lVar18] * dVar63) /
                            (dVar63 + (dVar202 + dVar189) * dVar157 + (dVar180 + dVar202) * dVar116
                             + (dVar189 + dVar88) * dVar87 + 1e-100) +
                            ((double)local_6f8[lVar52 + lVar18] * dVar179) /
                            (dVar179 + (dVar103 + dVar201) * dVar85 +
                                       (dVar196 + dVar156) * dVar188 + (dVar103 + dVar196) * dVar76
                            + 1e-100) +
                            ((double)local_6d8.p[lVar58 + lVar25 + lVar44] * dVar115) /
                            ((dVar107 + dVar102) * dVar141 + dVar115 + (dVar84 + dVar149) * dVar60 +
                             (dVar102 + dVar149) * dVar132 + 1e-100) +
                            (dVar140 * (double)local_6d8.p[lVar58 + lVar52 + lVar44]) /
                            ((dVar83 + dVar75) * dVar114 + dVar140 + (dVar83 + dVar148) * dVar106 +
                             (dVar101 + dVar148) * dVar131 + 1e-100) +
                            ((double)local_6d8.p[lVar28 + lVar25 + lVar44] * dVar59) /
                            (dVar59 + (dVar130 + dVar100) * dVar139 + (dVar82 + dVar130) * dVar105 +
                             (dVar100 + dVar147) * dVar113 + 1e-100) +
                            ((double)local_6d8.p[lVar28 + lVar52 + lVar44] * dVar112) /
                            (dVar112 + (dVar81 + dVar146) * dVar74 +
                                       (dVar138 + dVar99) * dVar129 + (dVar81 + dVar138) * dVar104 +
                            1e-100) + (double)local_6f8[lVar49 + lVar44] + dVar68 + dVar69 + dVar70
                                      + dVar71 + dVar72 + dVar73 + auVar110._0_8_ + auVar168._0_8_;
                dVar60 = ABS(local_388.p[lVar45 + lVar40 + lVar48 + local_388.nstride * 7]);
                dVar76 = ABS(local_388.p[lVar45 + lVar40 + lVar36 + local_388.nstride * 7]);
                auVar170._8_4_ = SUB84(dVar60,0);
                auVar170._0_8_ = dVar60;
                auVar170._12_4_ = (int)((ulong)dVar60 >> 0x20);
                dVar68 = dVar60 + ABS(local_388.p[lVar45 + lVar41 + lVar48 + local_388.nstride * 7])
                ;
                dVar70 = auVar170._8_8_ +
                         ABS(local_388.p[lVar51 + lVar40 + lVar48 + local_388.nstride * 7]);
                local_748 = local_388.p[lVar54 + lVar40 + lVar36 + local_388.nstride * 7];
                uStack_740 = 0;
                auVar171._0_8_ = ABS(local_388.p[lVar45 + lVar41 + lVar48 + local_388.nstride * 6]);
                auVar171._8_8_ = ABS(local_388.p[lVar51 + lVar40 + lVar48 + local_388.nstride * 5]);
                auVar96._0_8_ = dVar68 + 1e-100;
                auVar96._8_8_ = dVar70 + 1e-100;
                auVar172 = divpd(auVar171,auVar96);
                dVar64 = ABS(local_388.p[lVar45 + lVar56 + lVar48 + local_388.nstride * 7]);
                dVar61 = ABS(local_388.p[lVar45 + lVar56 + lVar36 + local_388.nstride * 7]);
                auVar159._8_4_ = SUB84(dVar64,0);
                auVar159._0_8_ = dVar64;
                auVar159._12_4_ = (int)((ulong)dVar64 >> 0x20);
                dVar71 = dVar64 + ABS(local_388.p[lVar45 + lVar37 + lVar48 + local_388.nstride * 7])
                ;
                dVar72 = auVar159._8_8_ +
                         ABS(local_388.p[lVar51 + lVar56 + lVar48 + local_388.nstride * 7]);
                local_738 = local_388.p[lVar54 + lVar56 + lVar36 + local_388.nstride * 7];
                uStack_730 = 0;
                auVar158._0_8_ = ABS(local_388.p[lVar45 + lVar56 + lVar48 + local_388.nstride * 6]);
                auVar158._8_8_ = ABS(local_388.p[lVar51 + lVar56 + lVar48 + local_388.nstride * 5]);
                auVar161._0_8_ = dVar71 + 1e-100;
                auVar161._8_8_ = dVar72 + 1e-100;
                auVar159 = divpd(auVar158,auVar161);
                dVar78 = ABS(local_388.p[lVar55 + lVar40 + lVar48 + local_388.nstride * 7]);
                dVar77 = ABS(local_388.p[lVar55 + lVar40 + lVar36 + local_388.nstride * 7]);
                dVar62 = ABS(local_388.p[lVar55 + lVar41 + lVar48 + local_388.nstride * 7]) + dVar78
                ;
                dVar63 = dVar78 + ABS(local_388.p[lVar54 + lVar40 + lVar48 + local_388.nstride * 7])
                ;
                auVar142._0_8_ = ABS(local_388.p[lVar55 + lVar40 + lVar36 + local_388.nstride * 4]);
                auVar142._8_8_ = ABS(local_388.p[lVar55 + lVar41 + lVar48 + local_388.nstride * 3]);
                auVar122._0_8_ = dVar78 + dVar77 + 1e-100;
                auVar122._8_8_ =
                     ABS(local_388.p[lVar54 + lVar40 + lVar48 + local_388.nstride * 7]) +
                     ABS(local_388.p[lVar54 + lVar41 + lVar48 + local_388.nstride * 7]) + dVar78 +
                     ABS(local_388.p[lVar55 + lVar41 + lVar48 + local_388.nstride * 7]) + 1e-100;
                auVar143 = divpd(auVar142,auVar122);
                auVar173._0_8_ = ABS(local_388.p[lVar55 + lVar41 + lVar48 + local_388.nstride * 6]);
                auVar173._8_8_ = ABS(local_388.p[lVar55 + lVar40 + lVar48 + local_388.nstride * 5]);
                auVar174._0_8_ = dVar62 + 1e-100;
                auVar174._8_8_ = dVar63 + 1e-100;
                auVar174 = divpd(auVar173,auVar174);
                dVar73 = ABS(local_388.p[lVar55 + lVar56 + lVar48 + local_388.nstride * 7]);
                dVar86 = ABS(local_388.p[lVar55 + lVar37 + lVar48 + local_388.nstride * 7]) + dVar73
                ;
                dVar81 = dVar73 + ABS(local_388.p[lVar54 + lVar56 + lVar48 + local_388.nstride * 7])
                ;
                dVar65 = ABS(local_388.p[lVar55 + lVar56 + lVar36 + local_388.nstride * 7]);
                auVar98._8_4_ = SUB84(dVar73,0);
                auVar98._0_8_ = dVar73;
                auVar98._12_4_ = (int)((ulong)dVar73 >> 0x20);
                auVar192._0_8_ = ABS(local_388.p[lVar55 + lVar56 + lVar36 + local_388.nstride * 4]);
                auVar192._8_8_ = ABS(local_388.p[lVar55 + lVar56 + lVar48 + local_388.nstride * 3]);
                auVar123._0_8_ = dVar65 + dVar73 + 1e-100;
                auVar123._8_8_ =
                     ABS(local_388.p[lVar54 + lVar56 + lVar48 + local_388.nstride * 7]) +
                     ABS(local_388.p[lVar54 + lVar37 + lVar48 + local_388.nstride * 7]) +
                     ABS(local_388.p[lVar55 + lVar37 + lVar48 + local_388.nstride * 7]) +
                     auVar98._8_8_ + 1e-100;
                auVar193 = divpd(auVar192,auVar123);
                auVar160._0_8_ = ABS(local_388.p[lVar55 + lVar56 + lVar48 + local_388.nstride * 6]);
                auVar160._8_8_ = ABS(local_388.p[lVar55 + lVar56 + lVar48 + local_388.nstride * 5]);
                auVar110._8_8_ = dVar81 + 1e-100;
                auVar110._0_8_ = dVar86 + 1e-100;
                auVar161 = divpd(auVar160,auVar110);
                dVar79 = ABS(local_388.p[lVar45 + lVar40 + lVar34 + local_388.nstride * 7]);
                dVar69 = ABS(local_388.p[lVar51 + lVar40 + lVar35 + local_388.nstride * 7]);
                dVar90 = ABS(local_388.p[lVar45 + lVar40 + lVar35 + local_388.nstride * 7]);
                auVar125._0_8_ = ABS(local_700[local_388.nstride * 2]);
                auVar125._8_8_ = ABS(local_388.p[lVar51 + lVar40 + lVar35 + local_388.nstride]);
                auVar194._8_4_ = SUB84(dVar79,0);
                auVar194._0_8_ = dVar79;
                auVar194._12_4_ = (int)((ulong)dVar79 >> 0x20);
                auVar91._8_4_ = SUB84(dVar90,0);
                auVar91._0_8_ = dVar90;
                auVar91._12_4_ = (int)((ulong)dVar90 >> 0x20);
                auVar195._0_8_ =
                     dVar79 + ABS(local_388.p[lVar45 + lVar41 + lVar34 + local_388.nstride * 7]) +
                     dVar90 + ABS(local_700[local_388.nstride * 7]) + 1e-100;
                auVar195._8_8_ =
                     auVar194._8_8_ +
                     ABS(local_388.p[lVar51 + lVar40 + lVar34 + local_388.nstride * 7]) +
                     auVar91._8_8_ + dVar69 + 1e-100;
                auVar110 = divpd(auVar125,auVar195);
                auVar144._0_8_ = ABS(local_388.p[lVar45 + lVar40 + lVar35 + local_388.nstride * 4]);
                auVar144._8_8_ = ABS(local_388.p[lVar51 + lVar41 + lVar35 + local_388.nstride * 3]);
                dVar59 = dVar90 + ABS(local_700[local_388.nstride * 7]);
                auVar151._0_8_ = dVar79 + dVar90 + 1e-100;
                auVar151._8_8_ =
                     dVar69 + dVar59 +
                     ABS(local_388.p[lVar51 + lVar41 + lVar35 + local_388.nstride * 7]) + 1e-100;
                auVar145 = divpd(auVar144,auVar151);
                auVar124._0_8_ = ABS(local_700[local_388.nstride * 6]);
                auVar124._8_8_ = ABS(local_388.p[lVar51 + lVar40 + lVar35 + local_388.nstride * 5]);
                auVar92._0_8_ = dVar59 + 1e-100;
                auVar92._8_8_ = auVar91._8_8_ + dVar69 + 1e-100;
                auVar125 = divpd(auVar124,auVar92);
                dVar79 = ABS(local_388.p[lVar45 + lVar56 + lVar34 + local_388.nstride * 7]);
                dVar140 = ABS(local_388.p[lVar45 + lVar56 + lVar35 + local_388.nstride * 7]);
                dVar59 = ABS(local_388.p[lVar51 + lVar56 + lVar35 + local_388.nstride * 7]);
                auVar153._8_4_ = SUB84(dVar79,0);
                auVar153._0_8_ = dVar79;
                auVar153._12_4_ = (int)((ulong)dVar79 >> 0x20);
                auVar200._0_8_ = ABS(local_388.p[lVar51 + lVar56 + lVar35 + local_388.nstride]);
                auVar200._8_8_ = ABS(local_388.p[lVar45 + lVar56 + lVar35 + local_388.nstride * 2]);
                auVar177._0_8_ =
                     dVar59 + dVar140 + dVar79 + ABS(local_388.p
                                                     [lVar51 + lVar56 + lVar34 + local_388.nstride *
                                                                                 7]) + 1e-100;
                auVar177._8_8_ =
                     dVar140 + ABS(local_388.p[lVar45 + lVar37 + lVar35 + local_388.nstride * 7]) +
                               auVar153._8_8_ +
                               ABS(local_388.p[lVar45 + lVar37 + lVar34 + local_388.nstride * 7]) +
                     1e-100;
                auVar191 = divpd(auVar200,auVar177);
                auVar186._8_4_ = SUB84(dVar140,0);
                auVar186._0_8_ = dVar140;
                auVar186._12_4_ = (int)((ulong)dVar140 >> 0x20);
                dVar69 = dVar140 + ABS(local_388.p[lVar45 + lVar37 + lVar35 + local_388.nstride * 7]
                                      );
                auVar199._0_8_ = ABS(local_388.p[lVar45 + lVar56 + lVar35 + local_388.nstride * 4]);
                auVar199._8_8_ = ABS(local_388.p[lVar51 + lVar56 + lVar35 + local_388.nstride * 3]);
                auVar175._0_8_ = dVar140 + dVar79 + 1e-100;
                auVar175._8_8_ =
                     ABS(local_388.p[lVar51 + lVar37 + lVar35 + local_388.nstride * 7]) + dVar69 +
                     dVar59 + 1e-100;
                auVar200 = divpd(auVar199,auVar175);
                auVar152._0_8_ = ABS(local_388.p[lVar45 + lVar56 + lVar35 + local_388.nstride * 6]);
                auVar152._8_8_ = ABS(local_388.p[lVar51 + lVar56 + lVar35 + local_388.nstride * 5]);
                auVar66._0_8_ = dVar69 + 1e-100;
                auVar66._8_8_ = auVar186._8_8_ + dVar59 + 1e-100;
                auVar153 = divpd(auVar152,auVar66);
                dVar74 = ABS(local_710[local_388.nstride * 7]);
                dVar79 = ABS(local_388.p[lVar54 + lVar40 + lVar35 + local_388.nstride * 7]);
                dVar69 = ABS(local_388.p[lVar55 + lVar40 + lVar34 + local_388.nstride * 7]);
                dVar59 = ABS(local_388.p[lVar55 + lVar41 + lVar35 + local_388.nstride * 7]);
                auVar154._8_4_ = SUB84(dVar69,0);
                auVar154._0_8_ = dVar69;
                auVar154._12_4_ = (int)((ulong)dVar69 >> 0x20);
                auVar176._0_8_ = ABS(local_388.p[lVar55 + lVar41 + lVar35 + local_388.nstride * 2]);
                auVar176._8_8_ = ABS(local_710[local_388.nstride]);
                auVar155._0_8_ =
                     dVar69 + ABS(local_388.p[lVar55 + lVar41 + lVar34 + local_388.nstride * 7]) +
                     dVar74 + dVar59 + 1e-100;
                auVar155._8_8_ =
                     auVar154._8_8_ + ABS(local_708[local_388.nstride * 7]) + dVar79 + dVar74 +
                     1e-100;
                auVar177 = divpd(auVar176,auVar155);
                auVar80._0_8_ = ABS(local_710[local_388.nstride * 4]);
                auVar80._8_8_ = ABS(local_388.p[lVar55 + lVar41 + lVar35 + local_388.nstride * 3]);
                auVar162._0_8_ = dVar74 + dVar69 + 1e-100;
                auVar162._8_8_ =
                     dVar79 + ABS(local_388.p[lVar54 + lVar41 + lVar35 + local_388.nstride * 7]) +
                     dVar74 + dVar59 + 1e-100;
                auVar170 = divpd(auVar80,auVar162);
                auVar185._0_8_ = ABS(local_388.p[lVar55 + lVar41 + lVar35 + local_388.nstride * 6]);
                auVar185._8_8_ = ABS(local_710[local_388.nstride * 5]);
                auVar126._0_8_ = dVar59 + dVar74 + 1e-100;
                auVar126._8_8_ = dVar74 + dVar79 + 1e-100;
                auVar186 = divpd(auVar185,auVar126);
                dVar75 = ABS(local_388.p[lVar55 + lVar56 + lVar34 + local_388.nstride * 7]);
                dVar79 = ABS(local_388.p[lVar55 + lVar37 + lVar35 + local_388.nstride * 7]);
                dVar69 = ABS(local_388.p[lVar55 + lVar56 + lVar35 + local_388.nstride * 7]);
                dVar59 = ABS(local_388.p[lVar54 + lVar56 + lVar35 + local_388.nstride * 7]);
                auVar67._0_8_ = ABS(local_388.p[lVar55 + lVar56 + lVar35 + local_388.nstride]);
                auVar67._8_8_ = ABS(local_388.p[lVar55 + lVar56 + lVar35 + local_388.nstride * 2]);
                auVar93._8_4_ = SUB84(dVar75,0);
                auVar93._0_8_ = dVar75;
                auVar93._12_4_ = (int)((ulong)dVar75 >> 0x20);
                auVar94._8_4_ = SUB84(dVar69,0);
                auVar94._0_8_ = dVar69;
                auVar94._12_4_ = (int)((ulong)dVar69 >> 0x20);
                auVar111._0_8_ =
                     dVar59 + dVar75 + ABS(local_388.p
                                           [lVar54 + lVar56 + lVar34 + local_388.nstride * 7]) +
                     dVar69 + 1e-100;
                auVar111._8_8_ =
                     dVar79 + auVar93._8_8_ +
                              ABS(local_388.p[lVar55 + lVar37 + lVar34 + local_388.nstride * 7]) +
                     auVar94._8_8_ + 1e-100;
                auVar168 = divpd(auVar67,auVar111);
                auVar95._0_8_ = ABS(local_388.p[lVar55 + lVar56 + lVar35 + local_388.nstride * 4]);
                auVar95._8_8_ = ABS(local_388.p[lVar55 + lVar56 + lVar35 + local_388.nstride * 3]);
                auVar136._0_8_ = dVar75 + dVar69 + 1e-100;
                auVar136._8_8_ =
                     dVar59 + ABS(local_388.p[lVar54 + lVar37 + lVar35 + local_388.nstride * 7]) +
                     dVar79 + auVar94._8_8_ + 1e-100;
                auVar96 = divpd(auVar95,auVar136);
                auVar97._0_8_ = ABS(local_388.p[lVar55 + lVar56 + lVar35 + local_388.nstride * 6]);
                auVar97._8_8_ = ABS(local_388.p[lVar55 + lVar56 + lVar35 + local_388.nstride * 5]);
                auVar127._0_8_ = dVar79 + dVar69 + 1e-100;
                auVar127._8_8_ = dVar69 + dVar59 + 1e-100;
                auVar98 = divpd(auVar97,auVar127);
                dVar68 = ((auVar98._8_8_ +
                           auVar96._8_8_ + auVar168._8_8_ + auVar168._0_8_ + 1.0 + auVar96._0_8_ +
                          auVar98._0_8_) * dVar69 * (double)local_6d8.p[lVar28 + lVar52 + lVar18] *
                          local_388.p[lVar55 + lVar56 + lVar35 + local_388.nstride * 8] +
                         (auVar186._8_8_ +
                          auVar170._8_8_ + auVar177._8_8_ + 1.0 + auVar177._0_8_ + auVar170._0_8_ +
                         auVar186._0_8_) * dVar74 * (double)local_6d8.p[lVar28 + lVar25 + lVar18] *
                         local_388.p[lVar55 + lVar41 + lVar35 + local_388.nstride * 8] +
                         (auVar153._8_8_ +
                          auVar200._8_8_ + auVar191._8_8_ + auVar191._0_8_ + 1.0 + auVar200._0_8_ +
                         auVar153._0_8_) * dVar140 * (double)local_6d8.p[lVar58 + lVar52 + lVar18] *
                         local_388.p[lVar51 + lVar56 + lVar35 + local_388.nstride * 8] +
                         (auVar125._8_8_ +
                          auVar145._8_8_ + auVar110._8_8_ + 1.0 + auVar110._0_8_ + auVar145._0_8_ +
                         auVar125._0_8_) * dVar90 * (double)local_6d8.p[lVar58 + lVar25 + lVar18] *
                         local_388.p[lVar51 + lVar41 + lVar35 + local_388.nstride * 8] +
                         (auVar161._8_8_ +
                          auVar193._8_8_ +
                          ABS(local_388.p[lVar55 + lVar56 + lVar36 + local_388.nstride * 2]) /
                          (ABS(local_388.p[lVar55 + lVar37 + lVar36 + local_388.nstride * 7]) +
                           dVar86 + dVar65 + 1e-100) +
                          ABS(local_388.p[lVar55 + lVar56 + lVar36 + local_388.nstride]) /
                          (dVar81 + ABS(local_738) + dVar65 + 1e-100) + 1.0 + auVar193._0_8_ +
                         auVar161._0_8_) * dVar73 * (double)local_6d8.p[lVar28 + lVar52 + lVar33] *
                         local_388.p[lVar55 + lVar56 + lVar36 + local_388.nstride * 8] +
                         (auVar174._8_8_ +
                          auVar143._8_8_ +
                          ABS(local_388.p[lVar55 + lVar41 + lVar36 + local_388.nstride * 2]) /
                          (dVar77 + dVar62 +
                           ABS(local_388.p[lVar55 + lVar41 + lVar36 + local_388.nstride * 7]) +
                          1e-100) + ABS(local_388.p[lVar55 + lVar40 + lVar36 + local_388.nstride]) /
                                    (dVar63 + ABS(local_748) + dVar77 + 1e-100) + 1.0 +
                          auVar143._0_8_ + auVar174._0_8_) * dVar78 *
                         (double)local_6d8.p[lVar28 + lVar25 + lVar33] *
                         local_388.p[lVar55 + lVar41 + lVar36 + local_388.nstride * 8] +
                         (auVar159._8_8_ +
                          ABS(local_388.p[lVar51 + lVar56 + lVar48 + local_388.nstride * 3]) /
                          (ABS(local_388.p[lVar51 + lVar56 + lVar48 + local_388.nstride * 7]) +
                           ABS(local_758) + dVar71 + 1e-100) +
                          ABS(local_388.p[lVar45 + lVar56 + lVar36 + local_388.nstride * 2]) /
                          (ABS(local_388.p[lVar45 + lVar37 + lVar36 + local_388.nstride * 7]) +
                           dVar71 + dVar61 + 1e-100) +
                          ABS(local_388.p[lVar51 + lVar56 + lVar36 + local_388.nstride]) /
                          (dVar72 + dVar61 +
                           ABS(local_388.p[lVar51 + lVar56 + lVar36 + local_388.nstride * 7]) +
                          1e-100) + 1.0 +
                          ABS(local_388.p[lVar45 + lVar56 + lVar36 + local_388.nstride * 4]) /
                          (dVar64 + dVar61 + 1e-100) + auVar159._0_8_) * dVar64 *
                         (double)local_6d8.p[lVar58 + lVar52 + lVar33] *
                         local_388.p[lVar51 + lVar56 + lVar36 + local_388.nstride * 8] +
                         (auVar172._8_8_ +
                          ABS(local_388.p[lVar51 + lVar41 + lVar48 + local_388.nstride * 3]) /
                          (ABS(local_388.p[lVar51 + lVar40 + lVar48 + local_388.nstride * 7]) +
                           dVar68 + ABS(local_388.p
                                        [lVar51 + lVar41 + lVar48 + local_388.nstride * 7]) + 1e-100
                          ) + ABS(local_388.p[lVar45 + lVar41 + lVar36 + local_388.nstride * 2]) /
                              (dVar76 + dVar68 +
                               ABS(local_388.p[lVar45 + lVar41 + lVar36 + local_388.nstride * 7]) +
                              1e-100) + ABS(local_388.p
                                            [lVar51 + lVar40 + lVar36 + local_388.nstride]) /
                                        (dVar70 + dVar76 +
                                         ABS(local_388.p
                                             [lVar51 + lVar40 + lVar36 + local_388.nstride * 7]) +
                                        1e-100) + 1.0 +
                          ABS(local_388.p[lVar45 + lVar40 + lVar36 + local_388.nstride * 4]) /
                          (dVar60 + dVar76 + 1e-100) + auVar172._0_8_) * dVar60 *
                         (double)local_6d8.p[lVar58 + lVar25 + lVar33] *
                         local_388.p[lVar51 + lVar41 + lVar36 + local_388.nstride * 8] + local_728)
                         * 0.125;
              }
              *(double *)
               ((lVar20 - mfi_1.beginIndex) * CONCAT44(mfi_1.fabArray._4_4_,(int)mfi_1.fabArray) * 8
                + CONCAT44(mfi_1.m_fa._M_t.
                           super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                           .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._4_4_,
                           (int)mfi_1.m_fa._M_t.
                                super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                                .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl) +
                ((long)iVar16 - (long)mfi_1.endIndex) * mfi_1.tile_size.vect._0_8_ * 8 +
               (lVar46 - mfi_1.currentIndex) * 8) = dVar68;
              lVar46 = lVar46 + 1;
            } while (local_7c4.bigend.vect[0] + 1 != (int)lVar46);
          }
        }
        local_6e8 = iVar16;
        iVar21 = iVar16 + 1;
      }
    }
    MFIter::operator++((MFIter *)&tmp_crhs);
  }
  MFIter::~MFIter((MFIter *)&tmp_crhs);
  mfi_1.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._4_4_ = 0;
  mfi_1.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._0_4_ = 1;
  mfi_1.fabArray._0_4_ = 0;
  mfi_1.fabArray._4_4_ = 0;
  mfi_1.tile_size.vect[0] = 0;
  mfi_1.tile_size.vect[1] = 0;
  mfi_1.tile_size.vect[2] = 0;
  mfi_1.flags = '\0';
  mfi_1._29_3_ = 0;
  mfi_1.currentIndex = 0;
  mfi_1.beginIndex = 0;
  local_6d8.p = (double *)&PTR__FabFactory_006d8928;
  MultiFab::MultiFab(&tmp_crhs,
                     &(((FabArray<amrex::FArrayBox> *)&local_718->super_FabArrayBase)->
                      super_FabArrayBase).boxarray,
                     &(((FabArray<amrex::FArrayBox> *)&local_718->super_FabArrayBase)->
                      super_FabArrayBase).distributionMap,1,0,(MFInfo *)&mfi_1,
                     (FabFactory<amrex::FArrayBox> *)&local_6d8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&mfi_1.tile_size);
  FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
            (&tmp_crhs.super_FabArray<amrex::FArrayBox>,0.0);
  PVar203 = Geometry::periodicity(this_00);
  mfi_1.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._0_4_ = PVar203.period.vect[0];
  mfi_1.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._4_4_ = PVar203.period.vect[1];
  mfi_1.fabArray._0_4_ = PVar203.period.vect[2];
  FabArray<amrex::FArrayBox>::ParallelCopy
            (&tmp_crhs.super_FabArray<amrex::FArrayBox>,&cfine.super_FabArray<amrex::FArrayBox>,
             (Periodicity *)&mfi_1,COPY);
  local_780._M_t.super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>.
  super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl =
       (local_7a0->super_MLNodeLinOp).m_nd_fine_mask.
       super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
       .
       super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[camrlev]._M_t.
       super___uniq_ptr_impl<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>._M_t;
  local_778._M_head_impl =
       *(LayoutData<int> **)
        &(local_7a0->super_MLNodeLinOp).m_has_fine_bndry.
         super_vector<std::unique_ptr<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>,_std::allocator<std::unique_ptr<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>_>_>
         .
         super__Vector_base<std::unique_ptr<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>,_std::allocator<std::unique_ptr<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[camrlev]._M_t.
         super___uniq_ptr_impl<amrex::LayoutData<int>,_std::default_delete<amrex::LayoutData<int>_>_>
  ;
  local_1c4.num_streams = Gpu::Device::max_gpu_streams;
  local_1c4.do_tiling = true;
  local_1c4.tilesize.vect[0] = (int)FabArrayBase::mfiter_tile_size;
  local_1c4.tilesize.vect[1] = FabArrayBase::mfiter_tile_size._4_4_;
  local_1c4.tilesize.vect[2] = DAT_006ddef0;
  local_1c4.dynamic = true;
  local_1c4.device_sync = true;
  MFIter::MFIter(&mfi_1,&local_718->super_FabArrayBase,&local_1c4);
  while (mfi_1.currentIndex < mfi_1.endIndex) {
    iVar17 = mfi_1.currentIndex;
    if (mfi_1.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
      iVar17 = ((mfi_1.local_index_map)->super_vector<int,_std::allocator<int>_>).
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start[mfi_1.currentIndex];
    }
    if (*(int *)(*(long *)&((local_778._M_head_impl)->m_data).
                           super_vector<int,_std::allocator<int>_>.
                           super__Vector_base<int,_std::allocator<int>_> + (long)iVar17 * 4) != 0) {
      MFIter::tilebox(&local_7c4,&mfi_1);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                ((Array4<double> *)&local_6d8,local_718,&mfi_1);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_698,&tmp_crhs.super_FabArray<amrex::FArrayBox>,&mfi_1);
      FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
                ((Array4<const_int> *)&local_388,
                 (FabArray<amrex::IArrayBox> *)
                 local_780._M_t.
                 super__Tuple_impl<0UL,_amrex::iMultiFab_*,_std::default_delete<amrex::iMultiFab>_>.
                 super__Head_base<0UL,_amrex::iMultiFab_*,_false>._M_head_impl,&mfi_1);
      local_768 = (long)local_7c4.smallend.vect[0];
      local_770 = local_768 * 4;
      local_760 = local_768 * 8;
      for (lVar22 = (long)local_7c4.smallend.vect[2]; (int)lVar22 <= local_7c4.bigend.vect[2];
          lVar22 = lVar22 + 1) {
        lVar46 = (long)local_388.p +
                 ((long)local_7c4.smallend.vect[1] - (long)local_388.begin.y) *
                 local_388.jstride * 4 + (lVar22 - local_388.begin.z) * local_388.kstride * 4 +
                 (long)local_388.begin.x * -4 + local_770;
        for (lVar20 = (long)local_7c4.smallend.vect[1]; lVar20 <= local_7c4.bigend.vect[1];
            lVar20 = lVar20 + 1) {
          if (local_7c4.smallend.vect[0] <= local_7c4.bigend.vect[0]) {
            lVar18 = 0;
            do {
              if (*(int *)(lVar46 + lVar18 * 4) == 2) {
                local_6d8.p
                [local_768 +
                 (((lVar22 - local_6d8.begin.z) * local_6d8.kstride +
                  (lVar20 - local_6d8.begin.y) * local_6d8.jstride + lVar18) -
                 (long)local_6d8.begin.x)] =
                     (double)local_698.p
                             [local_768 +
                              (((lVar22 - local_698.begin.z) * local_698.kstride +
                               (lVar20 - local_698.begin.y) * local_698.jstride + lVar18) -
                              (long)local_698.begin.x)];
              }
              lVar18 = lVar18 + 1;
            } while ((local_7c4.bigend.vect[0] - local_7c4.smallend.vect[0]) + 1 != (int)lVar18);
          }
          lVar46 = lVar46 + local_388.jstride * 4;
        }
      }
    }
    MFIter::operator++(&mfi_1);
  }
  MFIter::~MFIter(&mfi_1);
  MultiFab::~MultiFab(&tmp_crhs);
  MultiFab::~MultiFab(&cfine);
  if (local_7a8 != (_func_int **)0x0) {
    (**(code **)(*local_7a8 + 8))();
  }
  return;
}

Assistant:

void
MLNodeLaplacian::restrictInteriorNodes (int camrlev, MultiFab& crhs, MultiFab& a_frhs) const
{
    const BoxArray& fba = a_frhs.boxArray();
    const DistributionMapping& fdm = a_frhs.DistributionMap();
    const int amrrr = AMRRefRatio(camrlev);

    MultiFab* frhs = nullptr;
    std::unique_ptr<MultiFab> mf;
    if (a_frhs.nGrowVect().allGE(IntVect(amrrr-1)))
    {
        frhs = &a_frhs;
    }
    else
    {
        mf = std::make_unique<MultiFab>(fba, fdm, 1, amrrr-1);
        frhs = mf.get();
        MultiFab::Copy(*frhs, a_frhs, 0, 0, 1, 0);
    }

    const Geometry& cgeom = m_geom[camrlev  ][0];
    const Geometry& fgeom = m_geom[camrlev+1][0];

    const Box& f_nd_domain = amrex::surroundingNodes(fgeom.Domain());

    const auto lobc = LoBC();
    const auto hibc = HiBC();

    const iMultiFab& fdmsk = *m_dirichlet_mask[camrlev+1][0];
    const auto& stencil    =  m_nosigma_stencil[camrlev+1];

    MultiFab cfine(amrex::coarsen(fba, amrrr), fdm, 1, 0);

    frhs->setBndry(0.0);
    frhs->FillBoundary(fgeom.periodicity());

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(cfine, TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {
        const Box& bx = mfi.tilebox();
        Array4<Real> const& cfab = cfine.array(mfi);
        Array4<Real const> const& ffab = frhs->const_array(mfi);
        Array4<int const> const& mfab = fdmsk.const_array(mfi);
        if (m_coarsening_strategy == CoarseningStrategy::Sigma) {
            if (amrrr == 2) {
                AMREX_HOST_DEVICE_PARALLEL_FOR_3D(bx, i, j, k,
                {
                    mlndlap_restriction<2>(i,j,k,cfab,ffab,mfab,f_nd_domain,lobc,hibc);
                });
            } else {
                AMREX_HOST_DEVICE_PARALLEL_FOR_3D(bx, i, j, k,
                {
                    mlndlap_restriction<4>(i,j,k,cfab,ffab,mfab,f_nd_domain,lobc,hibc);
                });
            }
        } else {
            Array4<Real const> const& stfab = stencil->const_array(mfi);
            AMREX_HOST_DEVICE_PARALLEL_FOR_3D(bx, i, j, k,
            {
                mlndlap_restriction_rap(i,j,k,cfab,ffab,stfab,mfab);
            });
        }
    }

    MultiFab tmp_crhs(crhs.boxArray(), crhs.DistributionMap(), 1, 0);
    tmp_crhs.setVal(0.0);
    tmp_crhs.ParallelCopy(cfine, cgeom.periodicity());

    const iMultiFab& c_nd_mask = *m_nd_fine_mask[camrlev];
    const auto& has_fine_bndry = *m_has_fine_bndry[camrlev];

    MFItInfo mfi_info;
    if (Gpu::notInLaunchRegion()) mfi_info.EnableTiling().SetDynamic(true);
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(crhs, mfi_info); mfi.isValid(); ++mfi)
    {
        if (has_fine_bndry[mfi])
        {
            const Box& bx = mfi.tilebox();
            Array4<Real> const& dfab = crhs.array(mfi);
            Array4<Real const> const& sfab = tmp_crhs.const_array(mfi);
            Array4<int const> const& mfab = c_nd_mask.const_array(mfi);
            AMREX_HOST_DEVICE_PARALLEL_FOR_3D ( bx, i, j, k,
            {
                if (mfab(i,j,k) == fine_node) dfab(i,j,k) = sfab(i,j,k);
            });
        }
    }
}